

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  byte bVar1;
  PaUtilAllocationGroup *pPVar2;
  char *__s2;
  snd_ctl_t *psVar3;
  HwDevInfo *__ptr;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  char *pcVar17;
  pthread_t __thread1;
  PaDeviceInfo **ppPVar18;
  PaAlsaDeviceInfo *pPVar19;
  PaAlsaHostApiRepresentation *pPVar20;
  char *pcVar21;
  char *pcVar22;
  byte *pbVar23;
  byte *pbVar24;
  int __pa_unsure_error_id;
  HwDevInfo *pHVar25;
  snd_ctl_t *psVar26;
  bool bVar27;
  undefined8 uStack_140;
  char local_138 [8];
  char alsaCardName [50];
  char *local_f8;
  char buf [50];
  char *local_b8;
  char *alsaDeviceName;
  char *local_a8;
  uint local_9c;
  undefined8 local_98;
  snd_config_t *topNode;
  PaAlsaDeviceInfo *local_88;
  char *local_80;
  int local_78;
  uint local_74;
  int cardIdx;
  char *cardName;
  snd_ctl_t *ctl;
  int local_58;
  int local_54;
  int devIdx;
  int devIdx_1;
  HwDevInfo *local_48;
  PaAlsaHostApiRepresentation *local_40;
  ulong local_38;
  
  local_78 = -1;
  local_58 = 0;
  local_98 = 0;
  uStack_140 = 0x10e5bd;
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 == (char *)0x0) {
    local_74 = 1;
  }
  else {
    uStack_140 = 0x10e5ca;
    iVar5 = atoi(pcVar9);
    local_74 = (uint)(iVar5 == 0);
  }
  uStack_140 = 0x10e5e9;
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  local_38 = 0;
  if (pcVar9 == (char *)0x0) {
    local_a8 = "";
    topNode._4_4_ = 0;
  }
  else {
    uStack_140 = 0x10e5fe;
    iVar5 = atoi(pcVar9);
    topNode._4_4_ = (uint)(iVar5 != 0);
    local_a8 = "";
    if (iVar5 != 0) {
      local_a8 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_78 = -1;
  uStack_140 = 0x10e659;
  local_40 = alsaApi;
  sVar10 = snd_ctl_card_info_sizeof();
  lVar13 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9 = local_138 + lVar13;
  pcVar21 = local_138 + lVar13 + -8;
  alsaDeviceName = pcVar9;
  pcVar21[0] = '{';
  pcVar21[1] = -0x1a;
  pcVar21[2] = '\x10';
  pcVar21[3] = '\0';
  pcVar21[4] = '\0';
  pcVar21[5] = '\0';
  pcVar21[6] = '\0';
  pcVar21[7] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar22 = local_138 + lVar13 + -8;
  pcVar22[0] = -0x80;
  pcVar22[1] = -0x1a;
  pcVar22[2] = '\x10';
  pcVar22[3] = '\0';
  pcVar22[4] = '\0';
  pcVar22[5] = '\0';
  pcVar22[6] = '\0';
  pcVar22[7] = '\0';
  sVar10 = snd_pcm_info_sizeof();
  pcVar9 = pcVar9 + -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9[-8] = -0x62;
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar9[-8] = -0x5a;
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar5 = snd_card_next(&local_78);
  pPVar20 = local_40;
  if (local_78 < 0 || iVar5 != 0) {
    ctl = (snd_ctl_t *)0x1;
    local_48 = (HwDevInfo *)0x0;
    psVar26 = (snd_ctl_t *)0x0;
  }
  else {
    ctl = (snd_ctl_t *)0x1;
    local_38 = 0;
    psVar26 = (snd_ctl_t *)0x0;
    local_48 = (HwDevInfo *)0x0;
    local_80 = pcVar9;
    do {
      local_54 = -1;
      pcVar9[-8] = '\f';
      pcVar9[-7] = -0x19;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      snprintf(local_138,0x32,"hw:%d");
      pcVar9[-8] = '\x1a';
      pcVar9[-7] = -0x19;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar5 = snd_ctl_open(&cardName,local_138,0);
      pcVar17 = cardName;
      pcVar11 = alsaDeviceName;
      if (iVar5 < 0) {
        iVar5 = 6;
      }
      else {
        pcVar9[-8] = '5';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_card_info(pcVar17,pcVar11);
        pcVar9[-8] = '=';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar11 = (char *)snd_ctl_card_info_get_name(pcVar11);
        pcVar9[-8] = 'L';
        pcVar9[-7] = -0x19;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar20,(char **)&cardIdx,pcVar11);
        pcVar11 = cardName;
        if (paUtilErr_ < 0) {
          pcVar9[-8] = -0x56;
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1296\n"
                           );
          iVar5 = 10;
          local_38 = (ulong)(uint)paUtilErr_;
        }
        else {
          pcVar9[-8] = 'g';
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = snd_ctl_pcm_next_device(pcVar11,&local_54);
          pcVar11 = local_80;
          if (-1 < local_54 && iVar5 == 0) {
            do {
              pcVar17 = local_a8;
              pcVar9[-8] = -0x57;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snprintf((char *)&local_f8,0x32,"%s%s,%d",pcVar17,local_138);
              iVar5 = local_54;
              pcVar9[-8] = -0x4c;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_device(pcVar11,iVar5);
              pcVar9[-8] = -0x42;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_subdevice(pcVar11,0);
              pcVar9[-8] = -0x35;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_stream(pcVar11,1);
              pcVar17 = cardName;
              pcVar9[-8] = -0x29;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              uVar6 = snd_ctl_pcm_info(pcVar17,pcVar11);
              pcVar9[-8] = -0x1c;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snd_pcm_info_set_stream(pcVar11,0);
              pcVar17 = cardName;
              pcVar9[-8] = -0x10;
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              uVar7 = snd_ctl_pcm_info(pcVar17);
              if ((int)(uVar7 & uVar6) < 0) {
                iVar5 = 0xb;
              }
              else {
                local_9c = uVar7;
                pcVar9[-8] = '\x03';
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pbVar12 = (byte *)snd_pcm_info_get_name();
                pbVar4 = _cardIdx;
                bVar1 = *_cardIdx;
                pbVar24 = _cardIdx;
                while (bVar1 != 0) {
                  bVar1 = *pbVar12;
                  pbVar23 = pbVar12;
                  for (; (bVar1 != 0 && (pbVar23 = pbVar23 + 1, bVar1 == *pbVar24));
                      pbVar24 = pbVar24 + 1) {
                    bVar1 = *pbVar23;
                    if ((bVar1 & 0xdf) == 0) {
                      pbVar12 = pbVar23;
                    }
                  }
                  do {
                    bVar1 = *pbVar24;
                    if (bVar1 == 0) break;
                    pbVar24 = pbVar24 + 1;
                  } while (bVar1 != 0x20);
                  bVar1 = *pbVar24;
                }
                pbVar24 = (byte *)"-";
                if (*pbVar12 != 0) {
                  for (; bVar1 = *pbVar12, bVar1 == 0x20; pbVar12 = pbVar12 + 1) {
                  }
                  if ((bVar1 == 0x2d) || (pbVar24 = pbVar12, bVar1 == 0x3a)) {
                    pbVar24 = pbVar12 + (ulong)(pbVar12[1] == 0x20) * 2;
                  }
                }
                local_88 = (PaAlsaDeviceInfo *)CONCAT44(local_88._4_4_,uVar6);
                _devIdx = psVar26;
                pcVar9[-8] = -0x3f;
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar5 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar4,pbVar24,&local_f8);
                pPVar2 = pPVar20->allocations;
                pcVar9[-8] = -0x2b;
                pcVar9[-7] = -0x18;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar5 + 1));
                pbVar12 = _cardIdx;
                if (pcVar11 == (char *)0x0) {
                  pcVar9[-8] = -4;
                  pcVar9[-7] = -0x17;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1332\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar5 = 10;
                  pPVar20 = local_40;
                  psVar26 = _devIdx;
                  pcVar11 = local_80;
                }
                else {
                  pcVar9[-8] = -5;
                  pcVar9[-7] = -0x18;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  snprintf(pcVar11,(long)(iVar5 + 1),"%s: %s (%s)",pbVar12,pbVar24,&local_f8);
                  pHVar25 = local_48;
                  psVar26 = _devIdx + 1;
                  if ((local_48 == (HwDevInfo *)0x0) || (ctl < psVar26)) {
                    psVar3 = (snd_ctl_t *)((long)ctl * 2);
                    sVar10 = (long)ctl << 6;
                    pcVar9[-8] = ',';
                    pcVar9[-7] = -0x17;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    local_48 = (HwDevInfo *)realloc(pHVar25,sVar10);
                    uVar6 = (uint)local_88;
                    if (local_48 == (HwDevInfo *)0x0) {
                      pcVar9[-8] = 'D';
                      pcVar9[-7] = -0x16;
                      pcVar9[-6] = '\x10';
                      pcVar9[-5] = '\0';
                      pcVar9[-4] = '\0';
                      pcVar9[-3] = '\0';
                      pcVar9[-2] = '\0';
                      pcVar9[-1] = '\0';
                      PaUtil_DebugPrint(
                                       "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1342\n"
                                       );
                      local_38 = 0xffffd8f8;
                      iVar5 = 10;
                      local_48 = (HwDevInfo *)0x0;
                      pPVar20 = local_40;
                      pcVar11 = local_80;
                      ctl = psVar3;
                      goto LAB_0010e9b6;
                    }
                  }
                  else {
                    uVar6 = (uint)local_88;
                    psVar3 = ctl;
                  }
                  ctl = psVar3;
                  pPVar20 = local_40;
                  psVar3 = _devIdx;
                  pcVar9[-8] = '\\';
                  pcVar9[-7] = -0x17;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  paUtilErr_ = PaAlsa_StrDup(pPVar20,&local_b8,(char *)&local_f8);
                  if (paUtilErr_ < 0) {
                    pcVar9[-8] = '\"';
                    pcVar9[-7] = -0x16;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1345\n"
                                     );
                    iVar5 = 10;
                    local_38 = (ulong)(uint)paUtilErr_;
                    pPVar20 = local_40;
                    pcVar11 = local_80;
                  }
                  else {
                    local_48[(long)psVar3].alsaName = local_b8;
                    local_48[(long)psVar3].name = pcVar11;
                    local_48[(long)psVar3].isPlug = topNode._4_4_;
                    local_48[(long)psVar3].hasPlayback = ~local_9c >> 0x1f;
                    local_48[(long)psVar3].hasCapture = ~uVar6 >> 0x1f;
                    iVar5 = 0;
                    pPVar20 = local_40;
                    pcVar11 = local_80;
                  }
                }
              }
LAB_0010e9b6:
              pcVar17 = cardName;
              if ((iVar5 != 0xb) && (iVar5 != 0)) goto LAB_0010ea75;
              pcVar9[-8] = -0x29;
              pcVar9[-7] = -0x17;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              iVar5 = snd_ctl_pcm_next_device(pcVar17,&local_54);
            } while ((iVar5 == 0) && (-1 < local_54));
          }
          pcVar11 = cardName;
          pcVar9[-8] = 'l';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          snd_ctl_close(pcVar11);
          iVar5 = 0;
        }
      }
LAB_0010ea75:
      if ((iVar5 != 6) && (iVar5 != 0)) goto LAB_0010f046;
      pcVar9[-8] = -0x75;
      pcVar9[-7] = -0x16;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar5 = snd_card_next(&local_78);
    } while ((iVar5 == 0) && (-1 < local_78));
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x20;
    pcVar9[-7] = -0x16;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    iVar5 = snd_config_update();
    pPVar20 = local_40;
    if (iVar5 < 0) {
      pcVar9[-8] = -0x7e;
      pcVar9[-7] = -0x10;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      BuildDeviceList_cold_1();
      local_38 = 0xffffd8f1;
      goto LAB_0010f046;
    }
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x51;
    pcVar9[-7] = -0x10;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    __assert_fail("*alsa_snd_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x553,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
  }
  pcVar9[-8] = '\x15';
  pcVar9[-7] = -0x15;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar5 = snd_config_search(_snd_config,"pcm",&local_98);
  uVar16 = local_98;
  if (-1 < iVar5) {
    pcVar9[-8] = ')';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar13 = snd_config_iterator_first(uVar16);
    pcVar9[-8] = '4';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar14 = snd_config_iterator_next(lVar13);
    uVar16 = local_98;
    pcVar9[-8] = 'C';
    pcVar9[-7] = -0x15;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar15 = snd_config_iterator_end(uVar16);
    if (lVar13 == lVar15) {
      bVar27 = true;
    }
    else {
      do {
        local_f8 = "unknown";
        _cardIdx = (byte *)0x0;
        pcVar9[-8] = 'o';
        pcVar9[-7] = -0x15;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        uVar16 = snd_config_iterator_entry(lVar13);
        cardName = (char *)0x0;
        pcVar9[-8] = -0x77;
        pcVar9[-7] = -0x15;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = snd_config_search(uVar16,"type",&cardName);
        pcVar11 = cardName;
        if (iVar5 < 0) {
          if (iVar5 == -2) goto LAB_0010ebc0;
          pcVar9[-8] = '8';
          pcVar9[-7] = -0x13;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          __thread1 = pthread_self();
          pcVar9[-8] = 'J';
          pcVar9[-7] = -0x13;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar8 = pthread_equal(__thread1,paUnixMainThread);
          if (iVar8 != 0) {
            pcVar9[-8] = 'Y';
            pcVar9[-7] = -0x13;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar11 = (char *)snd_strerror(iVar5);
            pcVar9[-8] = 'i';
            pcVar9[-7] = -0x13;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar5,pcVar11);
          }
          pcVar9[-8] = 'w';
          pcVar9[-7] = -0x13;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
                           );
          local_38 = 0xffffd8f1;
          iVar5 = 10;
        }
        else {
          pcVar9[-8] = -99;
          pcVar9[-7] = -0x15;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = snd_config_get_string(pcVar11,&local_f8);
          if (iVar5 < 0) {
            pcVar9[-8] = '!';
            pcVar9[-7] = -0x12;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            BuildDeviceList_cold_2();
            local_38 = 0xffffd8f1;
            iVar5 = 10;
          }
          else {
LAB_0010ebc0:
            pcVar9[-8] = -0x34;
            pcVar9[-7] = -0x15;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar5 = snd_config_get_id(uVar16,&cardIdx);
            pbVar12 = _cardIdx;
            if (iVar5 < 0) {
              pcVar9[-8] = '<';
              pcVar9[-7] = -0x12;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              BuildDeviceList_cold_3();
              local_38 = 0xffffd8f1;
              iVar5 = 10;
            }
            else {
              pcVar9[-8] = -0xb;
              pcVar9[-7] = -0x15;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pcVar11 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
              if (pcVar11 != (char *)0x0) {
                pcVar9[-8] = '\x02';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar8 = atoi(pcVar11);
                iVar5 = 0x17;
                if (iVar8 != 0) goto LAB_0010ed8f;
              }
              lVar13 = 0;
              do {
                pcVar11 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar13);
                pcVar9[-8] = '%';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar5 = strcmp((char *)pbVar12,pcVar11);
                if (iVar5 == 0) {
                  iVar5 = 0x17;
                  goto LAB_0010ed8f;
                }
                lVar13 = lVar13 + 8;
              } while (lVar13 != 0x50);
              pPVar2 = local_40->allocations;
              pcVar9[-8] = 'J';
              pcVar9[-7] = -0x14;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              sVar10 = strlen((char *)pbVar12);
              pcVar9[-8] = 'V';
              pcVar9[-7] = -0x14;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 6);
              pbVar12 = _cardIdx;
              if (pcVar11 == (char *)0x0) {
                pcVar9[-8] = ']';
                pcVar9[-7] = -0x12;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                PaUtil_DebugPrint(
                                 "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1397\n"
                                 );
                local_38 = 0xffffd8f8;
                iVar5 = 10;
              }
              else {
                pcVar9[-8] = 'n';
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                strcpy(pcVar11,(char *)pbVar12);
                pbVar12 = _cardIdx;
                pPVar2 = local_40->allocations;
                pcVar9[-8] = -0x7e;
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                sVar10 = strlen((char *)pbVar12);
                pcVar9[-8] = -0x72;
                pcVar9[-7] = -0x14;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                pcVar17 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar10 + 1);
                pbVar12 = _cardIdx;
                if (pcVar17 == (char *)0x0) {
                  pcVar9[-8] = '~';
                  pcVar9[-7] = -0x12;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1400\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar5 = 10;
                }
                else {
                  pcVar9[-8] = -0x57;
                  pcVar9[-7] = -0x14;
                  pcVar9[-6] = '\x10';
                  pcVar9[-5] = '\0';
                  pcVar9[-4] = '\0';
                  pcVar9[-3] = '\0';
                  pcVar9[-2] = '\0';
                  pcVar9[-1] = '\0';
                  strcpy(pcVar17,(char *)pbVar12);
                  pHVar25 = local_48;
                  _devIdx = psVar26 + 1;
                  if ((local_48 == (HwDevInfo *)0x0) || (psVar3 = ctl, ctl < _devIdx)) {
                    psVar3 = (snd_ctl_t *)((long)ctl * 2);
                    sVar10 = (long)ctl << 6;
                    pcVar9[-8] = -0x2c;
                    pcVar9[-7] = -0x14;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    local_48 = (HwDevInfo *)realloc(pHVar25,sVar10);
                    if (local_48 == (HwDevInfo *)0x0) {
                      pcVar9[-8] = -0x61;
                      pcVar9[-7] = -0x12;
                      pcVar9[-6] = '\x10';
                      pcVar9[-5] = '\0';
                      pcVar9[-4] = '\0';
                      pcVar9[-3] = '\0';
                      pcVar9[-2] = '\0';
                      pcVar9[-1] = '\0';
                      PaUtil_DebugPrint(
                                       "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1408\n"
                                       );
                      local_38 = 0xffffd8f8;
                      iVar5 = 10;
                      local_48 = (HwDevInfo *)0x0;
                      psVar26 = _devIdx;
                      ctl = psVar3;
                      goto LAB_0010ed8f;
                    }
                  }
                  ctl = psVar3;
                  pHVar25 = predefinedNames;
                  if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010edc1:
                    pHVar25 = (HwDevInfo *)0x0;
                  }
                  else {
                    pcVar9[-8] = '\x01';
                    pcVar9[-7] = -0x13;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    iVar5 = strcmp(pcVar11,predefinedNames[0].alsaName);
                    if (iVar5 != 0) {
                      pHVar25 = predefinedNames;
                      do {
                        __s2 = pHVar25[1].alsaName;
                        if (__s2 == (char *)0x0) goto LAB_0010edc1;
                        pcVar9[-8] = '&';
                        pcVar9[-7] = -0x13;
                        pcVar9[-6] = '\x10';
                        pcVar9[-5] = '\0';
                        pcVar9[-4] = '\0';
                        pcVar9[-3] = '\0';
                        pcVar9[-2] = '\0';
                        pcVar9[-1] = '\0';
                        iVar5 = strcmp(pcVar11,__s2);
                        pHVar25 = pHVar25 + 1;
                      } while (iVar5 != 0);
                    }
                  }
                  local_48[(long)psVar26].alsaName = pcVar11;
                  local_48[(long)psVar26].name = pcVar17;
                  local_48[(long)psVar26].isPlug = 1;
                  if (pHVar25 == (HwDevInfo *)0x0) {
                    local_48[(long)psVar26].hasPlayback = 1;
                    local_48[(long)psVar26].hasCapture = 1;
                  }
                  else {
                    local_48[(long)psVar26].hasPlayback = pHVar25->hasPlayback;
                    local_48[(long)psVar26].hasCapture = pHVar25->hasCapture;
                  }
                  iVar5 = 0;
                  psVar26 = _devIdx;
                }
              }
            }
          }
        }
LAB_0010ed8f:
        if ((iVar5 != 0x17) && (iVar5 != 0)) goto LAB_0010eec0;
        pcVar9[-8] = -0x5c;
        pcVar9[-7] = -0x13;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar15 = snd_config_iterator_next(lVar14);
        uVar16 = local_98;
        pcVar9[-8] = -0x4d;
        pcVar9[-7] = -0x13;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar13 = snd_config_iterator_end(uVar16);
        bVar27 = lVar14 != lVar13;
        lVar13 = lVar14;
        lVar14 = lVar15;
      } while (bVar27);
      iVar5 = 0;
LAB_0010eec0:
      bVar27 = iVar5 == 0;
    }
    pPVar20 = local_40;
    if (!bVar27) goto LAB_0010f046;
  }
  pPVar2 = pPVar20->allocations;
  pcVar9[-8] = -0x17;
  pcVar9[-7] = -0x12;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  ppPVar18 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar26 * 8);
  (pPVar20->baseHostApiRep).deviceInfos = ppPVar18;
  if (ppPVar18 == (PaDeviceInfo **)0x0) {
    pcVar11 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
    ;
  }
  else {
    pPVar2 = pPVar20->allocations;
    pcVar9[-8] = '\r';
    pcVar9[-7] = -0x11;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    pPVar19 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar26 * 0x60);
    if (pPVar19 != (PaAlsaDeviceInfo *)0x0) {
      local_58 = 0;
      local_88 = pPVar19;
      _devIdx = psVar26;
      pHVar25 = local_48;
      for (; psVar26 != (snd_ctl_t *)0x0; psVar26 = psVar26 + -1) {
        pcVar11 = pHVar25->name;
        pcVar9[-8] = 'J';
        pcVar9[-7] = -0x11;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = strcmp(pcVar11,"dmix");
        iVar8 = 0x2a;
        if (iVar5 != 0) {
          pcVar9[-8] = 'c';
          pcVar9[-7] = -0x11;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = strcmp(pcVar11,"default");
          pPVar20 = local_40;
          uVar6 = local_74;
          if (iVar5 != 0) {
            pcVar9[-8] = '}';
            pcVar9[-7] = -0x11;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            FillInDevInfo(pPVar20,pHVar25,uVar6,pPVar19,&local_58);
            paUtilErr_ = 0;
            iVar8 = 0;
          }
        }
        if ((iVar8 != 0x2a) && (iVar8 != 0)) goto LAB_0010f046;
        pHVar25 = pHVar25 + 1;
        pPVar19 = pPVar19 + 1;
      }
      pPVar19 = local_88;
      pHVar25 = local_48;
      __ptr = local_48;
      if (_devIdx < (snd_ctl_t *)(long)local_58) {
        *(code **)(pcVar9 + -8) = CloseStream;
        __assert_fail("devIdx <= numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5b4,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      for (; local_48 = __ptr, _devIdx != (snd_ctl_t *)0x0; _devIdx = _devIdx + -1) {
        pcVar11 = pHVar25->name;
        pcVar9[-8] = -0x1e;
        pcVar9[-7] = -0x11;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar5 = strcmp(pcVar11,"dmix");
        if (iVar5 == 0) {
LAB_0010effa:
          pPVar20 = local_40;
          uVar6 = local_74;
          pcVar9[-8] = '\x10';
          pcVar9[-7] = -0x10;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          FillInDevInfo(pPVar20,pHVar25,uVar6,pPVar19,&local_58);
          paUtilErr_ = 0;
          iVar8 = 0;
        }
        else {
          pcVar9[-8] = -0xf;
          pcVar9[-7] = -0x11;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar5 = strcmp(pcVar11,"default");
          iVar8 = 0x2f;
          if (iVar5 == 0) goto LAB_0010effa;
        }
        if ((iVar8 != 0x2f) && (iVar8 != 0)) goto LAB_0010f046;
        pPVar19 = pPVar19 + 1;
        pHVar25 = pHVar25 + 1;
        __ptr = local_48;
      }
      pcVar9[-8] = '<';
      pcVar9[-7] = -0x10;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      free(__ptr);
      (local_40->baseHostApiRep).info.deviceCount = local_58;
      goto LAB_0010f046;
    }
    pcVar11 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1438\n"
    ;
  }
  pcVar9[-8] = 'p';
  pcVar9[-7] = -0x10;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  PaUtil_DebugPrint(pcVar11);
  local_38 = 0xffffd8f8;
LAB_0010f046:
  return (PaError)local_38;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}